

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawSprite
          (PixelGameEngine *this,int32_t x,int32_t y,Sprite *sprite,uint32_t scale,uint8_t flip)

{
  int iVar1;
  Pixel PVar2;
  int iVar3;
  int iVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  int x_00;
  uint32_t js;
  uint32_t uVar8;
  int32_t iVar9;
  int local_78;
  int local_74;
  
  if (sprite != (Sprite *)0x0) {
    local_78 = 0;
    iVar1 = 1;
    local_74 = 1;
    x_00 = 0;
    if ((flip & 1) != 0) {
      x_00 = sprite->width + -1;
      local_74 = -1;
    }
    if ((flip & 2) != 0) {
      local_78 = sprite->height + -1;
      iVar1 = -1;
    }
    iVar6 = sprite->width;
    if (scale < 2) {
      if (0 < iVar6) {
        iVar4 = sprite->height;
        iVar7 = 0;
        do {
          if (0 < iVar4) {
            iVar3 = 0;
            iVar6 = local_78;
            do {
              PVar2 = Sprite::GetPixel(sprite,x_00,iVar6);
              (*this->_vptr_PixelGameEngine[5])
                        (this,(ulong)(uint)(x + iVar7),(ulong)(uint)(y + iVar3),
                         (ulong)(uint)PVar2.field_0);
              iVar3 = iVar3 + 1;
              iVar6 = iVar6 + iVar1;
              iVar4 = sprite->height;
            } while (iVar3 < iVar4);
            iVar6 = sprite->width;
          }
          iVar7 = iVar7 + 1;
          x_00 = x_00 + local_74;
        } while (iVar7 < iVar6);
      }
    }
    else if (0 < iVar6) {
      iVar4 = sprite->height;
      iVar7 = 0;
      do {
        if (0 < iVar4) {
          iVar3 = 0;
          iVar6 = local_78;
          iVar9 = y;
          do {
            uVar5 = 0;
            do {
              uVar8 = 0;
              do {
                PVar2 = Sprite::GetPixel(sprite,x_00,iVar6);
                (*this->_vptr_PixelGameEngine[5])
                          (this,(ulong)(iVar7 * scale + x + uVar5),(ulong)(iVar9 + uVar8),
                           (ulong)(uint)PVar2.field_0);
                uVar8 = uVar8 + 1;
              } while (scale != uVar8);
              uVar5 = uVar5 + 1;
            } while (uVar5 != scale);
            iVar3 = iVar3 + 1;
            iVar6 = iVar6 + iVar1;
            iVar4 = sprite->height;
            iVar9 = iVar9 + scale;
          } while (iVar3 < iVar4);
          iVar6 = sprite->width;
        }
        iVar7 = iVar7 + 1;
        x_00 = x_00 + local_74;
      } while (iVar7 < iVar6);
    }
  }
  return;
}

Assistant:

void PixelGameEngine::DrawSprite(int32_t x, int32_t y, Sprite *sprite, uint32_t scale, uint8_t flip)
	{
		if (sprite == nullptr)
			return;

		int32_t fxs = 0, fxm = 1, fx = 0;
		int32_t fys = 0, fym = 1, fy = 0;
		if (flip & olc::Sprite::Flip::HORIZ)
		{
			fxs = sprite->width - 1;
			fxm = -1;
		}
		if (flip & olc::Sprite::Flip::VERT)
		{
			fys = sprite->height - 1;
			fym = -1;
		}

		if (scale > 1)
		{
			fx = fxs;
			for (int32_t i = 0; i < sprite->width; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < sprite->height; j++, fy += fym)
					for (uint32_t is = 0; is < scale; is++)
						for (uint32_t js = 0; js < scale; js++)
							Draw(x + (i * scale) + is, y + (j * scale) + js, sprite->GetPixel(fx, fy));
			}
		}
		else
		{
			fx = fxs;
			for (int32_t i = 0; i < sprite->width; i++, fx += fxm)
			{
				fy = fys;
				for (int32_t j = 0; j < sprite->height; j++, fy += fym)
					Draw(x + i, y + j, sprite->GetPixel(fx, fy));
			}
		}
	}